

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cc
# Opt level: O0

Result wabt::anon_unknown_0::FloatParser<double>::ParseFloat(char *s,char *end,Uint *out_bits)

{
  long lVar1;
  char *s_00;
  undefined8 uStack_60;
  double local_58;
  Float_conflict value;
  char *endptr;
  char *local_40;
  char *buffer_end;
  char *buffer;
  size_t kBufferSize;
  Uint *out_bits_local;
  char *end_local;
  char *s_local;
  
  kBufferSize = (size_t)out_bits;
  out_bits_local = (Uint *)end;
  end_local = s;
  if (end < s) {
    uStack_60 = 0x21a64f;
    __assert_fail("s <= end",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/literal.cc"
                  ,0xa0,
                  "static Result wabt::(anonymous namespace)::FloatParser<double>::ParseFloat(const char *, const char *, Uint *) [T = double]"
                 );
  }
  buffer = end + (1 - (long)s);
  lVar1 = -((ulong)(end + (0x10 - (long)s)) & 0xfffffffffffffff0);
  buffer_end = (char *)((long)&local_58 + lVar1);
  *(undefined8 *)((long)&uStack_60 + lVar1) = 0x21a68b;
  local_40 = std::
             copy_if<char_const*,char*,wabt::(anonymous_namespace)::FloatParser<double>::ParseFloat(char_const*,char_const*,unsigned_long*)::_lambda(char)_1_>
                       (s,end,(char *)((long)&local_58 + lVar1));
  s_00 = buffer_end;
  if (local_40 < buffer_end + (long)buffer) {
    *local_40 = '\0';
    *(undefined8 *)((long)&uStack_60 + lVar1) = 0x21a6d5;
    local_58 = FloatTraitsBase<double>::Strto(s_00,(char **)&value);
    if ((((char *)value == local_40) && ((local_58 != INFINITY || (NAN(local_58))))) &&
       ((local_58 != -INFINITY || (NAN(local_58))))) {
      *(double *)kBufferSize = local_58;
      *(undefined8 *)((long)&uStack_60 + lVar1) = 0x21a736;
      Result::Result((Result *)((long)&s_local + 4),Ok);
    }
    else {
      *(undefined8 *)((long)&uStack_60 + lVar1) = 0x21a71e;
      Result::Result((Result *)((long)&s_local + 4),Error);
    }
    return (Result)s_local._4_4_;
  }
  *(undefined8 *)((long)&uStack_60 + lVar1) = 0x21a6c1;
  __assert_fail("buffer_end < buffer + kBufferSize",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/literal.cc"
                ,0xa5,
                "static Result wabt::(anonymous namespace)::FloatParser<double>::ParseFloat(const char *, const char *, Uint *) [T = double]"
               );
}

Assistant:

Result FloatParser<T>::ParseFloat(const char* s,
                                  const char* end,
                                  Uint* out_bits) {
  // Here is the normal behavior for strtof/strtod:
  //
  // input     | errno  |   output   |
  // ---------------------------------
  // overflow  | ERANGE | +-HUGE_VAL |
  // underflow | ERANGE |        0.0 |
  // otherwise |      0 |      value |
  //
  // So normally we need to clear errno before calling strto{f,d}, and check
  // afterward whether it was set to ERANGE.
  //
  // glibc seems to have a bug where
  // strtof("340282356779733661637539395458142568448") will return HUGE_VAL,
  // but will not set errno to ERANGE. Since this function is only called when
  // we know that we have parsed a "normal" number (i.e. not "inf"), we know
  // that if we ever get HUGE_VAL, it must be overflow.
  //
  // The WebAssembly spec also ignores underflow, so we don't need to check for
  // ERANGE at all.

  // WebAssembly floats can contain underscores, but strto* can't parse those,
  // so remove them first.
  assert(s <= end);
  const size_t kBufferSize = end - s + 1;  // +1 for \0.
  char* buffer = static_cast<char*>(alloca(kBufferSize));
  auto buffer_end =
      std::copy_if(s, end, buffer, [](char c) -> bool { return c != '_'; });
  assert(buffer_end < buffer + kBufferSize);
  *buffer_end = 0;

  char* endptr;
  Float value = Traits::Strto(buffer, &endptr);
  if (endptr != buffer_end ||
      (value == Traits::kHugeVal || value == -Traits::kHugeVal)) {
    return Result::Error;
  }

  memcpy(out_bits, &value, sizeof(value));
  return Result::Ok;
}